

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O3

void __thiscall bioparser::test::BioparserMhapTest::Setup(BioparserMhapTest *this,string *file)

{
  Parser<bioparser::test::MhapOverlap> *pPVar1;
  undefined8 uVar2;
  undefined1 local_38 [24];
  undefined1 local_20 [16];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_38 + 8)
                 ,"/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/data/",
                 file);
  Parser<bioparser::test::MhapOverlap>::Create<bioparser::MhapParser>
            ((Parser<bioparser::test::MhapOverlap> *)local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_38 + 8));
  uVar2 = local_38._0_8_;
  local_38._0_8_ = (_func_int **)0x0;
  pPVar1 = (this->p)._M_t.
           super___uniq_ptr_impl<bioparser::Parser<bioparser::test::MhapOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
           .super__Head_base<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_false>.
           _M_head_impl;
  (this->p)._M_t.
  super___uniq_ptr_impl<bioparser::Parser<bioparser::test::MhapOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::MhapOverlap>_>_>
  .super__Head_base<0UL,_bioparser::Parser<bioparser::test::MhapOverlap>_*,_false>._M_head_impl =
       (Parser<bioparser::test::MhapOverlap> *)uVar2;
  if (pPVar1 != (Parser<bioparser::test::MhapOverlap> *)0x0) {
    (*pPVar1->_vptr_Parser[1])();
    if ((_func_int **)local_38._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_38._0_8_ + 8))();
    }
  }
  local_38._0_8_ = (_func_int **)0x0;
  if ((undefined1 *)local_38._8_8_ != local_20) {
    operator_delete((void *)local_38._8_8_);
  }
  return;
}

Assistant:

void Setup(const std::string& file) {
    p = Parser<MhapOverlap>::Create<MhapParser>(BIOPARSER_TEST_DATA + file);
  }